

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O0

Node __thiscall trieste::detail::Make::make_error(Make *this,Location *loc,string *msg)

{
  element_type *peVar1;
  string *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Node NVar2;
  Location local_d8;
  Token local_b8;
  undefined1 local_b0 [48];
  Token local_80;
  undefined1 local_78 [88];
  string *msg_local;
  Location *loc_local;
  Make *this_local;
  Node *n;
  
  local_78[0x4f] = 0;
  local_78._80_8_ = in_RCX;
  msg_local = msg;
  loc_local = loc;
  this_local = this;
  Token::Token((Token *)(local_78 + 0x40),(TokenDef *)Error);
  Location::Location((Location *)(local_78 + 0x20),(Location *)msg);
  NodeDef::create((NodeDef *)this,(Token *)(local_78 + 0x40),(Location *)(local_78 + 0x20));
  Location::~Location((Location *)(local_78 + 0x20));
  peVar1 = CLI::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  Token::Token(&local_80,(TokenDef *)ErrorMsg);
  Location::Location((Location *)(local_b0 + 0x10),(string *)local_78._80_8_);
  NodeDef::create((NodeDef *)local_78,&local_80,(Location *)(local_b0 + 0x10));
  NodeDef::push_back(peVar1,(Node *)local_78);
  CLI::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)local_78);
  Location::~Location((Location *)(local_b0 + 0x10));
  peVar1 = CLI::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  Token::Token(&local_b8,(TokenDef *)ErrorAst);
  Location::Location(&local_d8,(Location *)msg);
  NodeDef::create((NodeDef *)local_b0,&local_b8,&local_d8);
  NodeDef::push_back(peVar1,(Node *)local_b0);
  CLI::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)local_b0);
  Location::~Location(&local_d8);
  NVar2.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar2.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Node)NVar2.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node make_error(Location loc, const std::string& msg)
      {
        auto n = NodeDef::create(Error, loc);
        n->push_back(NodeDef::create(ErrorMsg, msg));
        n->push_back(NodeDef::create(ErrorAst, loc));
        return n;
      }